

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O2

CURLcode Curl_readwrite(connectdata *conn,Curl_easy *data,_Bool *done,_Bool *comeback)

{
  size_t sVar1;
  long *plVar2;
  int *piVar3;
  char **ppcVar4;
  char cVar5;
  _func_CURLcode_Curl_easy_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *p_Var6;
  Curl_handler *pCVar7;
  contenc_writer *writer;
  void *pvVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  undefined8 uVar11;
  undefined4 uVar12;
  undefined8 uVar13;
  undefined4 uVar14;
  undefined8 uVar15;
  undefined4 uVar16;
  _Bool _Var17;
  ushort uVar18;
  CURLcode CVar19;
  CHUNKcode code;
  uint uVar20;
  anon_enum_32 aVar21;
  int iVar22;
  size_t sVar23;
  char *pcVar24;
  size_t sVar25;
  timediff_t tVar26;
  size_t sVar27;
  curl_socket_t writefd;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  char *pcVar31;
  long lVar32;
  curl_socket_t readfd0;
  long lVar33;
  curl_off_t cVar34;
  long lVar35;
  bool bVar36;
  curltime cVar37;
  curltime older;
  curltime older_00;
  curltime newer;
  curltime newer_00;
  _Bool local_69;
  ssize_t bytes_written;
  int local_5c;
  _Bool readmore;
  undefined7 uStack_57;
  _Bool *local_50;
  uint local_44;
  SingleRequest *local_40;
  _Bool *local_38;
  
  uVar28 = conn->cselect_bits;
  conn->cselect_bits = 0;
  uVar20 = (data->req).keepon;
  writefd = -1;
  readfd0 = writefd;
  if ((uVar20 & 0x15) == 1) {
    readfd0 = conn->sockfd;
  }
  if ((uVar20 & 0x2a) == 2) {
    writefd = conn->writesockfd;
  }
  uVar28 = uVar28 | (conn->data->state).drain != 0;
  local_50 = done;
  if (uVar28 == 0) {
    uVar28 = Curl_socket_check(readfd0,-1,writefd,0);
  }
  if (uVar28 == 4) {
    Curl_failf(data,"select/poll returned error");
    return CURLE_SEND_ERROR;
  }
  local_40 = &data->req;
  uVar20 = (data->req).keepon;
  uVar30 = 0;
  local_38 = comeback;
  if (((uVar20 & 1) != 0) && (((uVar28 & 1) != 0 || (((conn->bits).field_0x6 & 0x40) != 0)))) {
    readmore = false;
    *local_50 = false;
    *comeback = false;
    iVar22 = 100;
    lVar32 = 0;
    uVar30 = 0;
    do {
      sVar27 = (data->set).buffer_size;
      lVar33 = (data->req).size;
      if (((lVar33 != -1) && (((data->req).field_0x570 & 1) == 0)) &&
         (sVar23 = lVar33 - (data->req).bytecount, (long)sVar23 < (long)sVar27)) {
        sVar27 = sVar23;
      }
      if (sVar27 != 0) {
        CVar19 = Curl_read(conn,conn->sockfd,(data->req).buf,sVar27,&bytes_written);
        if (CVar19 == CURLE_OK) goto LAB_0040f965;
        if (CVar19 != CURLE_AGAIN) {
          return CVar19;
        }
LAB_0040ff31:
        if (0 < iVar22) goto LAB_0040ff49;
        goto LAB_0040ff36;
      }
      bytes_written = 0;
LAB_0040f965:
      if ((((data->req).bytecount == 0) && ((data->req).writebytecount == 0)) &&
         (Curl_pgrsTime(data,TIMER_STARTTRANSFER), (data->req).exp100 != EXP100_SEND_DATA)) {
        cVar37 = Curl_now();
        (data->req).start100.tv_sec = cVar37.tv_sec;
        (data->req).start100.tv_usec = cVar37.tv_usec;
      }
      if (bytes_written == 0) {
        uVar20 = (uint)((data->req).bodywrites == 0);
      }
      else {
        uVar20 = 0;
      }
      if (bytes_written < 1 && uVar20 == 0) {
        piVar3 = &(data->req).keepon;
        *(byte *)piVar3 = (byte)*piVar3 & 0xfe;
LAB_0040ff2d:
        uVar30 = 1;
        goto LAB_0040ff31;
      }
      (data->req).buf[bytes_written] = '\0';
      (data->req).str = (data->req).buf;
      p_Var6 = conn->handler->readwrite;
      if (p_Var6 != (_func_CURLcode_Curl_easy_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *)0x0) {
        CVar19 = (*p_Var6)(data,conn,&bytes_written,&readmore);
        if (CVar19 != CURLE_OK) {
          return CVar19;
        }
        if (readmore != false) goto LAB_0040ff2d;
      }
      if (((data->req).field_0x570 & 1) != 0) {
        local_69 = false;
        CVar19 = Curl_http_readwrite_headers(data,conn,&bytes_written,&local_69);
        if (CVar19 != CURLE_OK) {
          return CVar19;
        }
        p_Var6 = conn->handler->readwrite;
        if (((p_Var6 != (_func_CURLcode_Curl_easy_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *)0x0)
            && ((data->req).maxdownload < 1)) && (0 < bytes_written)) {
          CVar19 = (*p_Var6)(data,conn,&bytes_written,&readmore);
          if (CVar19 != CURLE_OK) {
            return CVar19;
          }
          if (readmore != false) goto LAB_0040ff2d;
        }
        if (local_69 == true) {
          if (0 < bytes_written) {
            Curl_infof(data,"Excess found: excess = %zd url = %s (zero-length body)\n",bytes_written
                       ,(data->state).up.path);
          }
          goto LAB_0040ff2d;
        }
      }
      local_5c = iVar22;
      local_44 = uVar20;
      if ((((data->req).str != (char *)0x0) &&
          (uVar18 = *(ushort *)&(data->req).field_0x570, (uVar18 & 1) == 0)) &&
         (0 < bytes_written || uVar20 != 0)) {
        if (((data->set).field_0x87b & 0x10) != 0) {
          Curl_conncontrol(conn,2);
          *local_50 = true;
          return CURLE_WEIRD_SERVER_REPLY;
        }
        if (((data->req).bodywrites == 0 && uVar20 == 0) &&
           ((conn->handler->protocol & 0x40003) != 0)) {
          if ((data->req).newurl != (char *)0x0) {
            if (((conn->bits).field_0x4 & 1) != 0) {
              piVar3 = &(data->req).keepon;
              *(byte *)piVar3 = (byte)*piVar3 & 0xfe;
              *local_50 = true;
              uVar30 = 1;
              goto LAB_0040ff79;
            }
            *(ushort *)&(data->req).field_0x570 = uVar18 | 8;
            Curl_infof(data,"Ignoring the response-body\n");
          }
          lVar33 = (data->state).resume_from;
          if (((lVar33 != 0) && (uVar18 = *(ushort *)&(data->req).field_0x570, (uVar18 & 2) == 0))
             && (((uVar18 & 8) == 0 && ((data->set).httpreq == HTTPREQ_GET)))) {
            if (local_40->size != lVar33) {
              Curl_failf(data,"HTTP server doesn\'t seem to support byte ranges. Cannot resume.");
              return CURLE_RANGE_ERROR;
            }
            Curl_infof(data,"The entire document is already downloaded");
            uVar30 = 1;
            Curl_conncontrol(conn,1);
            piVar3 = &(data->req).keepon;
            *(byte *)piVar3 = (byte)*piVar3 & 0xfe;
            *local_50 = true;
            goto LAB_0040ff79;
          }
          if ((((data->set).timecondition != CURL_TIMECOND_NONE) &&
              ((data->state).range == (char *)0x0)) &&
             (_Var17 = Curl_meets_timecondition(data,(data->req).timeofdoc), !_Var17)) {
            *local_50 = true;
            (data->info).httpcode = 0x130;
            Curl_infof(data,"Simulate a HTTP 304 response!\n");
            uVar30 = 1;
            Curl_conncontrol(conn,1);
            goto LAB_0040ff79;
          }
        }
        plVar2 = &(data->req).bodywrites;
        *plVar2 = *plVar2 + 1;
        if ((((data->set).field_0x87b & 0x40) != 0) &&
           (((data->req).badheader == HEADER_NORMAL ||
            (Curl_debug(data,CURLINFO_DATA_IN,(data->state).headerbuff,(data->req).hbuflen),
            (data->req).badheader == HEADER_PARTHEADER)))) {
          Curl_debug(data,CURLINFO_DATA_IN,(data->req).str,bytes_written);
        }
        if (((data->req).field_0x570 & 0x20) != 0) {
          code = Curl_httpchunk_read(conn,(data->req).str,bytes_written,&bytes_written);
          if (CHUNKE_OK < code) {
            if (code != CHUNKE_WRITE_ERROR) {
              pcVar24 = Curl_chunked_strerror(code);
              Curl_failf(data,"%s in chunked-encoding",pcVar24);
              return CURLE_RECV_ERROR;
            }
            Curl_failf(data,"Failed writing data");
            return CURLE_WRITE_ERROR;
          }
          if ((code == CHUNKE_STOP) &&
             (piVar3 = &(data->req).keepon, *(byte *)piVar3 = (byte)*piVar3 & 0xfe,
             (conn->chunk).dataleft != 0)) {
            Curl_infof(conn->data,"Leftovers after chunking: %zu bytes\n");
          }
        }
        if ((data->req).badheader == HEADER_PARTHEADER) {
          cVar34 = (data->req).bytecount;
          if (((data->req).field_0x570 & 8) == 0) {
            cVar34 = cVar34 + (data->req).hbuflen;
            (data->req).bytecount = cVar34;
          }
        }
        else {
          cVar34 = (data->req).bytecount;
        }
        lVar33 = (data->req).maxdownload;
        if (lVar33 != -1) {
          lVar35 = (bytes_written + cVar34) - lVar33;
          if (lVar33 <= bytes_written + cVar34) {
            if ((lVar35 != 0) && (((data->req).field_0x570 & 8) == 0)) {
              Curl_infof(data,
                         "Excess found in a read: excess = %zu, size = %ld, maxdownload = %ld, bytecount = %ld\n"
                         ,lVar35,(data->req).size);
              lVar33 = (data->req).maxdownload;
              cVar34 = (data->req).bytecount;
            }
            bytes_written = lVar33 - cVar34;
            if (bytes_written < 1) {
              bytes_written = 0;
            }
            piVar3 = &(data->req).keepon;
            *(byte *)piVar3 = (byte)*piVar3 & 0xfe;
            lVar32 = lVar35;
          }
        }
        (data->req).bytecount = cVar34 + bytes_written;
        Curl_pgrsSetDownloadCounter(data,cVar34 + bytes_written);
        uVar18 = *(ushort *)&(data->req).field_0x570;
        if (((uVar18 & 0x20) == 0) &&
           (aVar21 = (data->req).badheader,
           (aVar21 != HEADER_NORMAL || bytes_written != 0) || (local_44 & 1) != 0)) {
          if ((char)((uVar18 & 8) >> 3) == '\0' && aVar21 != HEADER_NORMAL) {
            sVar27 = (data->req).maxdownload;
            sVar23 = (data->req).hbuflen;
            sVar25 = sVar27;
            if ((long)sVar23 < (long)sVar27) {
              sVar25 = sVar23;
            }
            if (sVar27 == 0xffffffffffffffff) {
              sVar25 = sVar23;
            }
            CVar19 = Curl_client_write(conn,1,(data->state).headerbuff,sVar25);
            if (CVar19 != CURLE_OK) {
              return CVar19;
            }
            aVar21 = (data->req).badheader;
          }
          if (aVar21 < HEADER_ALLBAD) {
            if (((conn->data->set).field_0x87c & 0x80) == 0) {
              writer = (data->req).writer_stack;
              uVar18 = *(ushort *)&(data->req).field_0x570;
              if (writer == (contenc_writer *)0x0) goto LAB_0040fe4c;
              if ((uVar18 & 8) != 0) goto LAB_0040fe7b;
              CVar19 = Curl_unencode_write(conn,writer,(data->req).str,bytes_written);
            }
            else {
              uVar18 = *(ushort *)&(data->req).field_0x570;
LAB_0040fe4c:
              if ((uVar18 & 8) != 0) goto LAB_0040fe7b;
              CVar19 = Curl_client_write(conn,1,(data->req).str,bytes_written);
            }
            (data->req).badheader = HEADER_NORMAL;
            if (CVar19 != CURLE_OK) {
              return CVar19;
            }
          }
          else {
LAB_0040fe7b:
            (data->req).badheader = HEADER_NORMAL;
          }
        }
      }
      uVar30 = 1;
      pCVar7 = conn->handler;
      p_Var6 = pCVar7->readwrite;
      if (((p_Var6 != (_func_CURLcode_Curl_easy_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *)0x0) &&
          (lVar32 != 0)) && (((conn->bits).field_0x6 & 0x40) == 0)) {
        pcVar24 = (data->req).str + bytes_written;
        (data->req).str = pcVar24;
        pcVar31 = (data->req).buf + (data->set).buffer_size;
        bytes_written = (long)pcVar31 - (long)pcVar24;
        if (pcVar24 + lVar32 <= pcVar31) {
          bytes_written = lVar32;
        }
        CVar19 = (*p_Var6)(data,conn,&bytes_written,&readmore);
        if (CVar19 != CURLE_OK) {
          return CVar19;
        }
        iVar22 = local_5c;
        if (readmore == true) {
          piVar3 = &(data->req).keepon;
          *(byte *)piVar3 = (byte)*piVar3 | 1;
        }
        goto LAB_0040ff31;
      }
      uVar20 = (data->req).keepon;
      if ((char)local_44 != '\0') {
        uVar20 = uVar20 & 0xfffffffe;
        (data->req).keepon = uVar20;
      }
      iVar22 = local_5c;
      if (((uVar20 & 0x10) != 0) ||
         (((pCVar7->protocol & 0x30) == 0 &&
          (_Var17 = Curl_ssl_data_pending(conn,0), iVar22 = local_5c, !_Var17)))) goto LAB_0040ff31;
      iVar22 = local_5c + -1;
      uVar30 = 1;
    } while (local_5c != 0);
    uVar30 = 1;
LAB_0040ff36:
    conn->cselect_bits = 1;
    *local_38 = true;
LAB_0040ff49:
    if ((((data->req).keepon & 3U) == 2) && (((conn->bits).field_0x4 & 1) != 0)) {
      Curl_infof(data,"we are done reading and this is set to close, stop send\n");
      piVar3 = &(data->req).keepon;
      *(byte *)piVar3 = (byte)*piVar3 & 0xfd;
    }
LAB_0040ff79:
    if (*local_50 != false) {
      return CURLE_OK;
    }
    uVar20 = (data->req).keepon;
  }
  uVar29 = uVar30;
  if ((uVar28 & uVar20 & 2) == 0) goto LAB_0041027e;
  if (((data->req).bytecount == 0) && ((data->req).writebytecount == 0)) {
    Curl_pgrsTime(data,TIMER_STARTTRANSFER);
  }
  uVar29 = uVar30 | 2;
  sVar27 = (data->req).upload_present;
  if (sVar27 == 0) {
    CVar19 = Curl_get_upload_buffer(data);
    if (CVar19 != CURLE_OK) {
      return CVar19;
    }
    (data->req).upload_fromhere = (data->state).ulbuf;
    if (((data->req).field_0x570 & 4) == 0) {
      pvVar8 = (data->req).protop;
      if (((data->req).exp100 == EXP100_SENDING_REQUEST) && (*(int *)((long)pvVar8 + 0x208) == 2)) {
        (data->req).exp100 = EXP100_AWAITING_CONTINUE;
        piVar3 = &(data->req).keepon;
        *(byte *)piVar3 = (byte)*piVar3 & 0xfd;
        cVar37 = Curl_now();
        (data->req).start100.tv_sec = cVar37.tv_sec;
        (data->req).start100.tv_usec = cVar37.tv_usec;
        Curl_expire(data,(data->set).expect_100_timeout,EXPIRE_100_TIMEOUT);
        uVar29 = uVar30;
        goto LAB_0041027e;
      }
      if ((conn->handler->protocol & 0x40003) == 0) {
        bVar36 = false;
      }
      else {
        bVar36 = *(int *)((long)pvVar8 + 0x208) == 1;
      }
      CVar19 = Curl_fillreadbuffer(conn,(data->set).upload_buffer_size,(size_t *)&readmore);
      if (CVar19 != CURLE_OK) {
        return CVar19;
      }
      sVar27 = CONCAT71(uStack_57,readmore);
      if (sVar27 != 0) {
        if (0 < (long)sVar27) {
          (data->req).upload_present = sVar27;
          if ((!bVar36) && ((*(ushort *)&(data->set).field_0x878 & 0x840) != 0)) {
            if ((data->state).scratch == (char *)0x0) {
              pcVar24 = (char *)(*Curl_cmalloc)((data->set).upload_buffer_size * 2);
              (data->state).scratch = pcVar24;
              if (pcVar24 == (char *)0x0) {
                Curl_failf(data,"Failed to alloc scratch buffer!");
                return CURLE_OUT_OF_MEMORY;
              }
            }
            sVar23 = 0;
            for (sVar25 = 0; sVar27 != sVar25; sVar25 = sVar25 + 1) {
              cVar5 = (data->req).upload_fromhere[sVar25];
              pcVar24 = (data->state).scratch;
              if (cVar5 == '\n') {
                sVar1 = sVar23 + 1;
                pcVar24[sVar23] = '\r';
                (data->state).scratch[sVar23 + 1] = '\n';
                sVar23 = sVar1;
                if ((((data->set).field_0x878 & 0x40) == 0) &&
                   (lVar32 = (data->state).infilesize, lVar32 != -1)) {
                  (data->state).infilesize = lVar32 + 1;
                }
              }
              else {
                pcVar24[sVar23] = cVar5;
              }
              sVar23 = sVar23 + 1;
            }
            if (sVar23 == sVar27) {
              sVar27 = (data->req).upload_present;
            }
            else {
              (data->req).upload_fromhere = (data->state).scratch;
              (data->req).upload_present = sVar23;
              sVar27 = sVar23;
            }
          }
          goto LAB_0040ffd0;
        }
        goto LAB_00410266;
      }
    }
    if (((data->req).keepon & 0x20) != 0) goto LAB_0041027e;
  }
  else {
LAB_0040ffd0:
    CVar19 = Curl_write(conn,conn->writesockfd,(data->req).upload_fromhere,sVar27,&bytes_written);
    if (CVar19 != CURLE_OK) {
      return CVar19;
    }
    if (((data->set).field_0x87b & 0x40) != 0) {
      Curl_debug(data,CURLINFO_DATA_OUT,(data->req).upload_fromhere,bytes_written);
    }
    lVar32 = (data->req).writebytecount + bytes_written;
    (data->req).writebytecount = lVar32;
    Curl_pgrsSetUploadCounter(data,lVar32);
    uVar18 = *(ushort *)&(data->req).field_0x570;
    if (((uVar18 & 0x140) != 0x40) && ((data->req).writebytecount == (data->state).infilesize)) {
      *(ushort *)&(data->req).field_0x570 = uVar18 | 4;
      Curl_infof(data,"We are completely uploaded and fine\n");
    }
    lVar32 = (data->req).upload_present - bytes_written;
    if (lVar32 != 0) {
      (data->req).upload_present = lVar32;
      ppcVar4 = &(data->req).upload_fromhere;
      *ppcVar4 = *ppcVar4 + bytes_written;
      goto LAB_0041027e;
    }
    CVar19 = Curl_get_upload_buffer(data);
    if (CVar19 != CURLE_OK) {
      return CVar19;
    }
    (data->req).upload_fromhere = (data->state).ulbuf;
    (data->req).upload_present = 0;
    if (((data->req).field_0x570 & 4) == 0) goto LAB_0041027e;
  }
LAB_00410266:
  CVar19 = done_sending(conn,local_40);
  if (CVar19 != CURLE_OK) {
    return CVar19;
  }
LAB_0041027e:
  cVar37 = Curl_now();
  (data->req).now.tv_sec = cVar37.tv_sec;
  (data->req).now.tv_usec = cVar37.tv_usec;
  if (((uVar29 == 0) && ((data->req).exp100 == EXP100_AWAITING_CONTINUE)) &&
     (uVar9 = (data->req).start100.tv_sec, uVar10 = (data->req).start100.tv_usec,
     older.tv_usec = uVar10, older.tv_sec = uVar9, older._12_4_ = 0, newer._12_4_ = 0,
     newer.tv_sec = SUB128(cVar37._0_12_,0), newer.tv_usec = SUB124(cVar37._0_12_,8),
     tVar26 = Curl_timediff(newer,older), (data->set).expect_100_timeout <= tVar26)) {
    (data->req).exp100 = EXP100_SEND_DATA;
    piVar3 = &(data->req).keepon;
    *(byte *)piVar3 = (byte)*piVar3 | 2;
    Curl_expire_done(data,EXPIRE_100_TIMEOUT);
    Curl_infof(data,"Done waiting for 100-continue\n");
  }
  iVar22 = Curl_pgrsUpdate(conn);
  if (iVar22 == 0) {
    uVar11 = (data->req).now.tv_sec;
    uVar12 = (data->req).now.tv_usec;
    cVar37.tv_usec = uVar12;
    cVar37.tv_sec = uVar11;
    cVar37._12_4_ = 0;
    CVar19 = Curl_speedcheck(data,cVar37);
    if (CVar19 != CURLE_OK) {
      return CVar19;
    }
    if ((data->req).keepon == 0) {
      if (((data->set).field_0x87b & 0x10) == 0) {
        lVar32 = local_40->size;
        if (((lVar32 != -1) && (lVar33 = (data->req).bytecount, lVar32 != lVar33)) &&
           ((lVar33 != lVar32 + (data->state).crlf_conversions &&
            ((data->req).newurl == (char *)0x0)))) {
          Curl_failf(data,"transfer closed with %ld bytes remaining to read");
          return CURLE_PARTIAL_FILE;
        }
        if ((((data->req).field_0x570 & 0x20) != 0) && ((conn->chunk).state != CHUNK_STOP)) {
          Curl_failf(data,"transfer closed with outstanding read data remaining");
          return CURLE_PARTIAL_FILE;
        }
      }
      iVar22 = Curl_pgrsUpdate(conn);
      if (iVar22 != 0) {
        return CURLE_ABORTED_BY_CALLBACK;
      }
    }
    else {
      tVar26 = Curl_timeleft(data,&(data->req).now,false);
      if (tVar26 < 0) {
        lVar32 = (data->req).size;
        uVar15 = (data->req).now.tv_sec;
        uVar16 = (data->req).now.tv_usec;
        newer_00.tv_usec = uVar16;
        newer_00.tv_sec = uVar15;
        uVar13 = (data->progress).t_startsingle.tv_sec;
        uVar14 = (data->progress).t_startsingle.tv_usec;
        older_00.tv_usec = uVar14;
        older_00.tv_sec = uVar13;
        older_00._12_4_ = 0;
        newer_00._12_4_ = 0;
        tVar26 = Curl_timediff(newer_00,older_00);
        cVar34 = (data->req).bytecount;
        if (lVar32 == -1) {
          Curl_failf(data,"Operation timed out after %ld milliseconds with %ld bytes received",
                     tVar26,cVar34);
        }
        else {
          Curl_failf(data,
                     "Operation timed out after %ld milliseconds with %ld out of %ld bytes received"
                     ,tVar26,cVar34,(data->req).size);
        }
        return CURLE_OPERATION_TIMEDOUT;
      }
    }
    *local_50 = ((data->req).keepon & 0x33) == 0;
    return CURLE_OK;
  }
  return CURLE_ABORTED_BY_CALLBACK;
}

Assistant:

CURLcode Curl_readwrite(struct connectdata *conn,
                        struct Curl_easy *data,
                        bool *done,
                        bool *comeback)
{
  struct SingleRequest *k = &data->req;
  CURLcode result;
  int didwhat = 0;

  curl_socket_t fd_read;
  curl_socket_t fd_write;
  int select_res = conn->cselect_bits;

  conn->cselect_bits = 0;

  /* only use the proper socket if the *_HOLD bit is not set simultaneously as
     then we are in rate limiting state in that transfer direction */

  if((k->keepon & KEEP_RECVBITS) == KEEP_RECV)
    fd_read = conn->sockfd;
  else
    fd_read = CURL_SOCKET_BAD;

  if((k->keepon & KEEP_SENDBITS) == KEEP_SEND)
    fd_write = conn->writesockfd;
  else
    fd_write = CURL_SOCKET_BAD;

  if(conn->data->state.drain) {
    select_res |= CURL_CSELECT_IN;
    DEBUGF(infof(data, "Curl_readwrite: forcibly told to drain data\n"));
  }

  if(!select_res) /* Call for select()/poll() only, if read/write/error
                     status is not known. */
    select_res = Curl_socket_check(fd_read, CURL_SOCKET_BAD, fd_write, 0);

  if(select_res == CURL_CSELECT_ERR) {
    failf(data, "select/poll returned error");
    return CURLE_SEND_ERROR;
  }

  /* We go ahead and do a read if we have a readable socket or if
     the stream was rewound (in which case we have data in a
     buffer) */
  if((k->keepon & KEEP_RECV) &&
     ((select_res & CURL_CSELECT_IN) || conn->bits.stream_was_rewound)) {

    result = readwrite_data(data, conn, k, &didwhat, done, comeback);
    if(result || *done)
      return result;
  }

  /* If we still have writing to do, we check if we have a writable socket. */
  if((k->keepon & KEEP_SEND) && (select_res & CURL_CSELECT_OUT)) {
    /* write */

    result = readwrite_upload(data, conn, &didwhat);
    if(result)
      return result;
  }

  k->now = Curl_now();
  if(didwhat) {
    ;
  }
  else {
    /* no read no write, this is a timeout? */
    if(k->exp100 == EXP100_AWAITING_CONTINUE) {
      /* This should allow some time for the header to arrive, but only a
         very short time as otherwise it'll be too much wasted time too
         often. */

      /* Quoting RFC2616, section "8.2.3 Use of the 100 (Continue) Status":

         Therefore, when a client sends this header field to an origin server
         (possibly via a proxy) from which it has never seen a 100 (Continue)
         status, the client SHOULD NOT wait for an indefinite period before
         sending the request body.

      */

      timediff_t ms = Curl_timediff(k->now, k->start100);
      if(ms >= data->set.expect_100_timeout) {
        /* we've waited long enough, continue anyway */
        k->exp100 = EXP100_SEND_DATA;
        k->keepon |= KEEP_SEND;
        Curl_expire_done(data, EXPIRE_100_TIMEOUT);
        infof(data, "Done waiting for 100-continue\n");
      }
    }
  }

  if(Curl_pgrsUpdate(conn))
    result = CURLE_ABORTED_BY_CALLBACK;
  else
    result = Curl_speedcheck(data, k->now);
  if(result)
    return result;

  if(k->keepon) {
    if(0 > Curl_timeleft(data, &k->now, FALSE)) {
      if(k->size != -1) {
        failf(data, "Operation timed out after %" CURL_FORMAT_TIMEDIFF_T
              " milliseconds with %" CURL_FORMAT_CURL_OFF_T " out of %"
              CURL_FORMAT_CURL_OFF_T " bytes received",
              Curl_timediff(k->now, data->progress.t_startsingle),
              k->bytecount, k->size);
      }
      else {
        failf(data, "Operation timed out after %" CURL_FORMAT_TIMEDIFF_T
              " milliseconds with %" CURL_FORMAT_CURL_OFF_T " bytes received",
              Curl_timediff(k->now, data->progress.t_startsingle),
              k->bytecount);
      }
      return CURLE_OPERATION_TIMEDOUT;
    }
  }
  else {
    /*
     * The transfer has been performed. Just make some general checks before
     * returning.
     */

    if(!(data->set.opt_no_body) && (k->size != -1) &&
       (k->bytecount != k->size) &&
#ifdef CURL_DO_LINEEND_CONV
       /* Most FTP servers don't adjust their file SIZE response for CRLFs,
          so we'll check to see if the discrepancy can be explained
          by the number of CRLFs we've changed to LFs.
       */
       (k->bytecount != (k->size + data->state.crlf_conversions)) &&
#endif /* CURL_DO_LINEEND_CONV */
       !k->newurl) {
      failf(data, "transfer closed with %" CURL_FORMAT_CURL_OFF_T
            " bytes remaining to read", k->size - k->bytecount);
      return CURLE_PARTIAL_FILE;
    }
    if(!(data->set.opt_no_body) && k->chunk &&
       (conn->chunk.state != CHUNK_STOP)) {
      /*
       * In chunked mode, return an error if the connection is closed prior to
       * the empty (terminating) chunk is read.
       *
       * The condition above used to check for
       * conn->proto.http->chunk.datasize != 0 which is true after reading
       * *any* chunk, not just the empty chunk.
       *
       */
      failf(data, "transfer closed with outstanding read data remaining");
      return CURLE_PARTIAL_FILE;
    }
    if(Curl_pgrsUpdate(conn))
      return CURLE_ABORTED_BY_CALLBACK;
  }

  /* Now update the "done" boolean we return */
  *done = (0 == (k->keepon&(KEEP_RECV|KEEP_SEND|
                            KEEP_RECV_PAUSE|KEEP_SEND_PAUSE))) ? TRUE : FALSE;

  return CURLE_OK;
}